

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void cashew::ValueBuilder::appendToObjectAsSetter(Ref array,IString key,IString param,Ref value)

{
  Value *this;
  char cVar1;
  Ref *this_00;
  undefined8 *puVar2;
  Ref RVar3;
  Ref RVar4;
  Ref r;
  Value *pVVar5;
  undefined1 local_50 [8];
  IString key_local;
  IString param_local;
  Ref array_local;
  
  param_local.str._M_len = (size_t)param.str._M_str;
  key_local.str._M_str = (char *)param.str._M_len;
  key_local.str._M_len = (size_t)key.str._M_str;
  local_50 = (undefined1  [8])key.str._M_len;
  param_local.str._M_str = (char *)array.inst;
  this_00 = (Ref *)cashew::Ref::operator[]((int)&param_local + 8);
  cVar1 = cashew::Ref::operator==(this_00,(IString *)&OBJECT);
  if (cVar1 != '\0') {
    puVar2 = (undefined8 *)cashew::Ref::operator[]((int)&param_local + 8);
    this = (Value *)*puVar2;
    RVar3 = makeRawArray(2);
    RVar4 = makeRawArray(3);
    r = makeRawString((IString *)&SETTER);
    pVVar5 = Value::push_back(RVar4.inst,r);
    RVar4 = makeRawString((IString *)local_50);
    pVVar5 = Value::push_back(pVVar5,RVar4);
    RVar4 = makeRawString((IString *)&key_local.str._M_str);
    RVar4.inst = Value::push_back(pVVar5,RVar4);
    pVVar5 = Value::push_back(RVar3.inst,RVar4);
    RVar3.inst = Value::push_back(pVVar5,value);
    Value::push_back(this,RVar3);
    return;
  }
  __assert_fail("array[0] == OBJECT",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x742,
                "static void cashew::ValueBuilder::appendToObjectAsSetter(Ref, IString, IString, Ref)"
               );
}

Assistant:

static void
  appendToObjectAsSetter(Ref array, IString key, IString param, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(3)
                                          ->push_back(makeRawString(SETTER))
                                          .push_back(makeRawString(key))
                                          .push_back(makeRawString(param)))
                           .push_back(value));
  }